

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t flushAll(ion_bpp_handle_t handle)

{
  ion_bpp_err_t iVar1;
  ion_bpp_buffer_t *local_30;
  ion_bpp_buffer_t *buf;
  ion_bpp_err_t rc;
  ion_bpp_h_node_t *h;
  ion_bpp_handle_t handle_local;
  
  if ((*(int *)((long)handle + 0x44) == 0) ||
     (handle_local._4_4_ = flush(handle,(ion_bpp_buffer_t *)((long)handle + 0x20)),
     handle_local._4_4_ == bErrOk)) {
    for (local_30 = *(ion_bpp_buffer_t **)((long)handle + 0x48);
        local_30 != (ion_bpp_buffer_t *)((long)handle + 0x48); local_30 = local_30->next) {
      if ((local_30->modified != boolean_false) && (iVar1 = flush(handle,local_30), iVar1 != bErrOk)
         ) {
        return iVar1;
      }
    }
    handle_local._4_4_ = bErrOk;
  }
  return handle_local._4_4_;
}

Assistant:

static ion_bpp_err_t
flushAll(
	ion_bpp_handle_t handle
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*buf;				/* buffer */

	if (h->root.modified) {
		if ((rc = flush(handle, &h->root)) != 0) {
			return rc;
		}
	}

	buf = h->bufList.next;

	while (buf != &h->bufList) {
		if (buf->modified) {
			if ((rc = flush(handle, buf)) != 0) {
				return rc;
			}
		}

		buf = buf->next;
	}

	return bErrOk;
}